

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O0

bool Kernel::InferenceStore::Smt2ProofCheckPrinter::isBuiltInSort(ostream *out,uint sortCons)

{
  bool bVar1;
  ostream *this;
  uint in_ESI;
  ostream *in_RDI;
  TermList sortInstance;
  Stack<Kernel::TermList> args;
  uint arity;
  Signature *sig;
  undefined4 in_stack_fffffffffffffee8;
  undefined2 in_stack_fffffffffffffeec;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  TermList in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  TermList in_stack_ffffffffffffff10;
  bool local_e2;
  undefined8 in_stack_ffffffffffffff38;
  Stack<Kernel::TermList> *this_00;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  TermList local_b0;
  TermList local_a8;
  TermList local_a0;
  uint64_t local_98;
  TermList local_80 [2];
  RangeIterator<unsigned_int> local_70;
  TermList *args_00;
  uint arity_00;
  uint in_stack_ffffffffffffffac;
  Stack<Kernel::TermList> local_40;
  uint local_1c;
  Signature *local_18;
  uint local_c;
  ostream *local_8;
  
  local_18 = DAT_01333830;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_1c = Signature::typeConArity
                       ((Signature *)in_stack_fffffffffffffef0._content,
                        CONCAT13(in_stack_fffffffffffffeef,
                                 CONCAT12(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec)));
  local_70 = (RangeIterator<unsigned_int>)
             Lib::$_0::operator()
                       ((anon_class_1_0_00000001 *)
                        CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                        (uint)in_stack_ffffffffffffff38);
  args_00 = (TermList *)local_70._0_8_;
  arity_00 = local_70._to;
  Lib::IterTraits<Lib::RangeIterator<unsigned_int>>::
  map<Kernel::InferenceStore::Smt2ProofCheckPrinter::isBuiltInSort(std::ostream&,unsigned_int)::_lambda(auto:1)_1_>
            ((IterTraits<Lib::RangeIterator<unsigned_int>_> *)&stack0xffffffffffffffa0);
  this_00 = &local_40;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/InferenceStore.cpp:856:20),_Kernel::TermList>_>
  ::collect<Lib::Stack>
            ((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_InferenceStore_cpp:856:20),_Kernel::TermList>_>
              *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  Lib::Stack<Kernel::TermList>::begin(this_00);
  AtomicSort::create(in_stack_ffffffffffffffac,arity_00,args_00);
  TermList::TermList((TermList *)in_stack_fffffffffffffef0._content,
                     (Term *)CONCAT17(in_stack_fffffffffffffeef,
                                      CONCAT16(in_stack_fffffffffffffeee,
                                               CONCAT24(in_stack_fffffffffffffeec,
                                                        in_stack_fffffffffffffee8))));
  local_98 = local_80[0]._content;
  bVar1 = Signature::isTermAlgebraSort
                    ((Signature *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                     in_stack_ffffffffffffff10);
  if (bVar1) {
    this = std::operator<<(local_8,
                           "=== warning term algebras are not yet implemented for proof checking =="
                          );
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = Signature::isArrayCon(local_18,local_c);
  local_e2 = true;
  if (!bVar1) {
    local_a0 = AtomicSort::intSort();
    bVar1 = TermList::operator==(local_80,&local_a0);
    local_e2 = true;
    if (!bVar1) {
      local_a8 = AtomicSort::realSort();
      bVar1 = TermList::operator==(local_80,&local_a8);
      local_e2 = true;
      if (!bVar1) {
        in_stack_fffffffffffffef0 = AtomicSort::rationalSort();
        local_b0 = in_stack_fffffffffffffef0;
        local_e2 = TermList::operator==(local_80,&local_b0);
      }
    }
  }
  Lib::Stack<Kernel::TermList>::~Stack
            ((Stack<Kernel::TermList> *)in_stack_fffffffffffffef0._content);
  return (bool)(local_e2 & 1);
}

Assistant:

static bool isBuiltInSort(std::ostream& out, unsigned sortCons) {
    auto& sig = *env.signature;
    auto arity = sig.typeConArity(sortCons);
    auto args = range(0, arity)
              .map([](auto _a) { return AtomicSort::intSort(); })
              .template collect<Stack>();
    auto sortInstance = TermList(AtomicSort::create(sortCons, arity, args.begin()));
    if (env.signature->isTermAlgebraSort(sortInstance)) {
      out << "=== warning term algebras are not yet implemented for proof checking ==" << std::endl;
    }
    return sig.isArrayCon(sortCons)
      || sortInstance == AtomicSort::intSort()
      || sortInstance == AtomicSort::realSort()
      || sortInstance == AtomicSort::rationalSort();
  }